

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  int iVar3;
  LocationRecorder location;
  
  bVar1 = Consume(this,"import");
  if (!bVar1) {
    return false;
  }
  bVar1 = LookingAt(this,"public");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,root_location,10,public_dependency->current_size_);
    bVar1 = Consume(this,"public");
    if (!bVar1) {
LAB_002d5e20:
      LocationRecorder::~LocationRecorder(&location);
      return false;
    }
    iVar3 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    piVar2 = RepeatedField<int>::Add(public_dependency);
  }
  else {
    bVar1 = LookingAt(this,"weak");
    if (!bVar1) goto LAB_002d5dc5;
    LocationRecorder::LocationRecorder(&location,root_location,0xb,weak_dependency->current_size_);
    bVar1 = Consume(this,"weak");
    if (!bVar1) goto LAB_002d5e20;
    iVar3 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    piVar2 = RepeatedField<int>::Add(weak_dependency);
  }
  *piVar2 = iVar3;
  LocationRecorder::~LocationRecorder(&location);
LAB_002d5dc5:
  LocationRecorder::LocationRecorder
            (&location,root_location,3,(dependency->super_RepeatedPtrFieldBase).current_size_);
  output = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(dependency);
  bVar1 = ConsumeString(this,output,"Expected a string naming the file to import.");
  if (bVar1) {
    LocationRecorder::EndAt(&location,&this->input_->previous_);
    bVar1 = ConsumeEndOfDeclaration(this,";",&location);
  }
  else {
    bVar1 = false;
  }
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("import"));
  if (LookingAt("public")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }
  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kDependencyFieldNumber,
                              dependency->size());
    DO(ConsumeString(dependency->Add(),
      "Expected a string naming the file to import."));

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }
  return true;
}